

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparators.cpp
# Opt level: O2

int duckdb::Comparators::TemplatedCompareListLoop<unsigned_long>
              (data_ptr_t *left_ptr,data_ptr_t *right_ptr,ValidityBytes *left_validity,
              ValidityBytes *right_validity,idx_t *count)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  idx_t i;
  ulong uVar5;
  uint uVar6;
  
  uVar5 = 0;
  do {
    if (*count <= uVar5) {
      return 0;
    }
    uVar4 = 0xff;
    uVar6 = 0xff;
    if (left_validity->validity_mask != (uchar *)0x0) {
      uVar6 = (uint)left_validity->validity_mask[uVar5 >> 3];
    }
    uVar2 = (uint)uVar5 & 7;
    uVar3 = 1 << (sbyte)uVar2;
    if (right_validity->validity_mask != (uchar *)0x0) {
      uVar4 = (uint)right_validity->validity_mask[uVar5 >> 3];
    }
    uVar1 = TemplatedCompareAndAdvance<unsigned_long>(left_ptr,right_ptr);
    uVar2 = (uint)(((uVar4 | uVar6) >> uVar2 & 1) != 0);
    if ((uVar6 & uVar3) != 0) {
      uVar2 = -(uint)((uVar4 & uVar3) == 0) | uVar1;
    }
    uVar5 = uVar5 + 1;
  } while (uVar2 == 0);
  return uVar2;
}

Assistant:

int Comparators::TemplatedCompareListLoop(data_ptr_t &left_ptr, data_ptr_t &right_ptr,
                                          const ValidityBytes &left_validity, const ValidityBytes &right_validity,
                                          const idx_t &count) {
	int comp_res = 0;
	bool left_valid;
	bool right_valid;
	idx_t entry_idx;
	idx_t idx_in_entry;
	for (idx_t i = 0; i < count; i++) {
		ValidityBytes::GetEntryIndex(i, entry_idx, idx_in_entry);
		left_valid = left_validity.RowIsValid(left_validity.GetValidityEntry(entry_idx), idx_in_entry);
		right_valid = right_validity.RowIsValid(right_validity.GetValidityEntry(entry_idx), idx_in_entry);
		comp_res = TemplatedCompareAndAdvance<T>(left_ptr, right_ptr);
		if (!left_valid && !right_valid) {
			comp_res = 0;
		} else if (!left_valid) {
			comp_res = 1;
		} else if (!right_valid) {
			comp_res = -1;
		}
		if (comp_res != 0) {
			break;
		}
	}
	return comp_res;
}